

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
helics::apps::Connector::addConnection
          (Connector *this,string_view interface1,string_view interface2,
          InterfaceDirection direction,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *connectionTags)

{
  pointer pbVar1;
  string_view interfaceName;
  string_view interfaceName_00;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  pointer pbVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  string_view tagName;
  string_view iview2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> svtags;
  string_view iview1;
  Connection local_b8;
  size_t local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  basic_string_view<char,_std::char_traits<char>_> __tmp;
  
  local_60 = interface2._M_str;
  local_68 = interface2._M_len;
  local_50 = interface1._M_str;
  local_58 = interface1._M_len;
  svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&svtags,(long)(connectionTags->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(connectionTags->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = (connectionTags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (connectionTags->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    tagName._M_str = (pbVar6->_M_dataplus)._M_p;
    tagName._M_len = pbVar6->_M_string_length;
    local_b8.interface1._M_len = addTag(this,tagName);
    CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&svtags,(unsigned_long *)&local_b8);
  }
  interfaceName_00._M_str = local_50;
  interfaceName_00._M_len = local_58;
  iview1 = addInterface(this,interfaceName_00);
  interfaceName._M_str = local_60;
  interfaceName._M_len = local_68;
  iview2 = addInterface(this,interfaceName);
  local_b8.interface1._M_len = iview1._M_len;
  local_b8.interface1._M_str = iview1._M_str;
  local_b8.interface2._M_len = iview2._M_len;
  local_b8.interface2._M_str = iview2._M_str;
  local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8.tags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.stringBuffer.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b8.stringBuffer.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b8.direction = direction;
  iVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&iview1,0,6,"REGEX:");
  pcVar3 = local_b8.interface1._M_str;
  sVar2 = local_b8.interface1._M_len;
  if (iVar5 == 0) {
    if (direction == TO_FROM) {
      __tmp._M_len = local_b8.interface1._M_len;
      __tmp._M_str = local_b8.interface1._M_str;
      local_b8.interface1._M_len = local_b8.interface2._M_len;
      local_b8.interface1._M_str = local_b8.interface2._M_str;
      local_b8.interface2._M_len = sVar2;
      local_b8.interface2._M_str = pcVar3;
    }
    else if (direction == BIDIRECTIONAL) {
      std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
      emplace_back<helics::apps::Connection&>
                ((vector<helics::apps::Connection,std::allocator<helics::apps::Connection>> *)
                 &this->matchers,&local_b8);
      pcVar3 = local_b8.interface1._M_str;
      sVar2 = local_b8.interface1._M_len;
      __tmp._M_len = local_b8.interface1._M_len;
      __tmp._M_str = local_b8.interface1._M_str;
      local_b8.interface1._M_len = local_b8.interface2._M_len;
      local_b8.interface1._M_str = local_b8.interface2._M_str;
      local_b8.interface2._M_len = sVar2;
      local_b8.interface2._M_str = pcVar3;
    }
    else if (direction != FROM_TO) goto LAB_001b2f2e;
    CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
    emplace_back<helics::apps::Connection>(&this->matchers,&local_b8);
    goto LAB_001b2f2e;
  }
  pbVar7 = &iview1;
  if (direction != FROM_TO) {
    if (direction == BIDIRECTIONAL) {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection&>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->connections,&iview2,&local_b8);
      bVar4 = std::operator==(iview1,iview2);
      if (bVar4) goto LAB_001b2f2e;
    }
    else {
      pbVar7 = &iview2;
      if (direction != TO_FROM) goto LAB_001b2f2e;
    }
  }
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,helics::apps::Connection>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->connections,pbVar7,&local_b8);
LAB_001b2f2e:
  Connection::~Connection(&local_b8);
  CLI::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&svtags.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void Connector::addConnection(std::string_view interface1,
                              std::string_view interface2,
                              InterfaceDirection direction,
                              const std::vector<std::string>& connectionTags)
{
    std::vector<std::size_t> svtags;
    svtags.reserve(connectionTags.size());
    for (const auto& tag : connectionTags) {
        svtags.push_back(addTag(tag));
    }
    auto iview1 = addInterface(interface1);
    auto iview2 = addInterface(interface2);
    Connection conn{iview1, iview2, direction, std::move(svtags), nullptr};
    if (iview1.compare(0, 6, "REGEX:") == 0) {
        switch (direction) {
            case InterfaceDirection::TO_FROM:
                std::swap(conn.interface1, conn.interface2);
                matchers.emplace_back(std::move(conn));
                break;
            case InterfaceDirection::FROM_TO:
                matchers.emplace_back(std::move(conn));
                break;
            case InterfaceDirection::BIDIRECTIONAL:
                matchers.emplace_back(conn);
                std::swap(conn.interface1, conn.interface2);
                matchers.emplace_back(std::move(conn));
                break;
        }
    } else {
        switch (direction) {
            case InterfaceDirection::TO_FROM:
                connections.emplace(iview2, std::move(conn));
                break;
            case InterfaceDirection::FROM_TO:
                connections.emplace(iview1, std::move(conn));
                break;
            case InterfaceDirection::BIDIRECTIONAL:
                connections.emplace(iview2, conn);
                if (iview1 != iview2) {
                    connections.emplace(iview1, std::move(conn));
                }
                break;
        }
    }
}